

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall
acto::actor::mem_handler_t<msg_ball,_Player,_const_msg_ball_&>::invoke
          (mem_handler_t<msg_ball,_Player,_const_msg_ball_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  Player *__args;
  actor_ref aStack_28;
  
  __args = this->ptr_;
  actor_ref::actor_ref
            (&aStack_28,
             ((msg->_M_t).
              super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
              .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl)->sender,true);
  std::function<void_(Player_*,_acto::actor_ref,_const_msg_ball_&)>::operator()
            (&this->func_,__args,&aStack_28,
             (msg_ball *)
             (msg->_M_t).
             super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
             super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
             super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl);
  actor_ref::~actor_ref(&aStack_28);
  return;
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      func_(ptr_, actor_ref(msg->sender, true),
            static_cast<message_reference_t<M, P>>(*msg.get()).data());
    }